

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

ScriptFunction * __thiscall FBehavior::GetFunction(FBehavior *this,int funcnum,FBehavior **module)

{
  ScriptFunction *pSVar1;
  byte bVar2;
  
  while( true ) {
    if ((uint)this->NumFunctions <= (uint)funcnum) {
      return (ScriptFunction *)0x0;
    }
    pSVar1 = this->Functions + funcnum;
    bVar2 = this->Functions[funcnum].ImportNum;
    if (bVar2 == 0) break;
    this = (this->Imports).Array[bVar2 - 1];
    funcnum = pSVar1->Address;
  }
  *module = this;
  return pSVar1;
}

Assistant:

ScriptFunction *FBehavior::GetFunction (int funcnum, FBehavior *&module) const
{
	if ((unsigned)funcnum >= (unsigned)NumFunctions)
	{
		return NULL;
	}
	ScriptFunction *funcdef = (ScriptFunction *)Functions + funcnum;
	if (funcdef->ImportNum)
	{
		return Imports[funcdef->ImportNum - 1]->GetFunction (funcdef->Address, module);
	}
	// Should I just un-const this function instead of using a const_cast?
	module = const_cast<FBehavior *>(this);
	return funcdef;
}